

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O1

int32_t __thiscall
icu_63::OlsonTimeZone::getOffset
          (OlsonTimeZone *this,uint8_t era,int32_t year,int32_t month,int32_t dom,uint8_t dow,
          int32_t millis,UErrorCode *ec)

{
  int iVar1;
  
  if ((uint)month < 0xc) {
    iVar1 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[5])
                      (this,(ulong)era);
  }
  else {
    if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
      *ec = U_ILLEGAL_ARGUMENT_ERROR;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int32_t OlsonTimeZone::getOffset(uint8_t era, int32_t year, int32_t month,
                                 int32_t dom, uint8_t dow,
                                 int32_t millis, UErrorCode& ec) const {
    if (month < UCAL_JANUARY || month > UCAL_DECEMBER) {
        if (U_SUCCESS(ec)) {
            ec = U_ILLEGAL_ARGUMENT_ERROR;
        }
        return 0;
    } else {
        return getOffset(era, year, month, dom, dow, millis,
                         Grego::monthLength(year, month),
                         ec);
    }
}